

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_header_encoder.c
# Opt level: O2

lzma_ret lzma_block_header_size(lzma_block *block)

{
  lzma_vli *plVar1;
  uint32_t uVar2;
  lzma_ret lVar3;
  lzma_vli lVar4;
  int iVar5;
  lzma_filter *plVar6;
  long lVar7;
  uint32_t add;
  
  if (block->version == 0) {
    lVar4 = block->compressed_size;
    lVar3 = LZMA_PROG_ERROR;
    if (lVar4 == 0xffffffffffffffff) {
      iVar5 = 6;
    }
    else {
      uVar2 = lzma_vli_size(lVar4);
      iVar5 = 6;
      if (lVar4 != 0) {
        iVar5 = uVar2 + 6;
      }
      if (lVar4 == 0 || uVar2 == 0) {
        return LZMA_PROG_ERROR;
      }
    }
    if (block->uncompressed_size != 0xffffffffffffffff) {
      uVar2 = lzma_vli_size(block->uncompressed_size);
      if (uVar2 == 0) {
        return LZMA_PROG_ERROR;
      }
      iVar5 = iVar5 + uVar2;
    }
    plVar6 = block->filters;
    if ((plVar6 != (lzma_filter *)0x0) && (lVar4 = plVar6->id, lVar4 != 0xffffffffffffffff)) {
      lVar7 = 0;
      while (lVar4 != 0xffffffffffffffff) {
        if (lVar7 == 0x40) {
          return LZMA_PROG_ERROR;
        }
        lVar3 = lzma_filter_flags_size(&add,(lzma_filter *)((long)&plVar6->id + lVar7));
        if (lVar3 != LZMA_OK) {
          return lVar3;
        }
        iVar5 = iVar5 + add;
        plVar6 = block->filters;
        plVar1 = (lzma_vli *)((long)&plVar6[1].id + lVar7);
        lVar7 = lVar7 + 0x10;
        lVar4 = *plVar1;
      }
      block->header_size = iVar5 + 3U & 0xfffffffc;
      lVar3 = LZMA_OK;
    }
  }
  else {
    lVar3 = LZMA_OPTIONS_ERROR;
  }
  return lVar3;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_block_header_size(lzma_block *block)
{
	size_t i;

	// Block Header Size + Block Flags + CRC32.
	uint32_t size = 1 + 1 + 4;

	if (block->version != 0)
		return LZMA_OPTIONS_ERROR;

	// Compressed Size
	if (block->compressed_size != LZMA_VLI_UNKNOWN) {
		const uint32_t add = lzma_vli_size(block->compressed_size);
		if (add == 0 || block->compressed_size == 0)
			return LZMA_PROG_ERROR;

		size += add;
	}

	// Uncompressed Size
	if (block->uncompressed_size != LZMA_VLI_UNKNOWN) {
		const uint32_t add = lzma_vli_size(block->uncompressed_size);
		if (add == 0)
			return LZMA_PROG_ERROR;

		size += add;
	}

	// List of Filter Flags
	if (block->filters == NULL || block->filters[0].id == LZMA_VLI_UNKNOWN)
		return LZMA_PROG_ERROR;

	for (i = 0; block->filters[i].id != LZMA_VLI_UNKNOWN; ++i) {
		uint32_t add;

		// Don't allow too many filters.
		if (i == LZMA_FILTERS_MAX)
			return LZMA_PROG_ERROR;

		return_if_error(lzma_filter_flags_size(&add,
				block->filters + i));

		size += add;
	}

	// Pad to a multiple of four bytes.
	block->header_size = (size + 3) & ~UINT32_C(3);

	// NOTE: We don't verify that the encoded size of the Block stays
	// within limits. This is because it is possible that we are called
	// with exaggerated Compressed Size (e.g. LZMA_VLI_MAX) to reserve
	// space for Block Header, and later called again with lower,
	// real values.

	return LZMA_OK;
}